

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

pair<const_char_*,_int> google::protobuf::internal::ReadSizeFallback(char *p,uint32 res)

{
  uint in_ESI;
  long in_RDI;
  pair<const_char_*,_int> pVar1;
  uint32_t byte;
  uint32 byte_1;
  uint32_t i;
  char *local_60;
  int local_54;
  void *local_50;
  int local_44;
  void *local_40;
  uint local_34;
  char *local_30;
  uint local_24;
  uint local_20;
  uint local_1c [3];
  undefined1 local_10 [12];
  
  local_20 = 1;
  local_1c[0] = in_ESI;
  do {
    if (3 < local_20) {
      local_34 = (uint)*(byte *)(in_RDI + 4);
      if (local_34 < 8) {
        local_1c[0] = (local_34 - 1) * 0x10000000 + local_1c[0];
        if (local_1c[0] < 0x7ffffff0) {
          local_60 = (char *)(in_RDI + 5);
          std::pair<const_char_*,_int>::pair<const_char_*,_unsigned_int_&,_true>
                    ((pair<const_char_*,_int> *)local_10,&local_60,local_1c);
        }
        else {
          local_50 = (void *)0x0;
          local_54 = 0;
          std::pair<const_char_*,_int>::pair<std::nullptr_t,_int,_true>
                    ((pair<const_char_*,_int> *)local_10,&local_50,&local_54);
        }
      }
      else {
        local_40 = (void *)0x0;
        local_44 = 0;
        std::pair<const_char_*,_int>::pair<std::nullptr_t,_int,_true>
                  ((pair<const_char_*,_int> *)local_10,&local_40,&local_44);
      }
LAB_003d3265:
      pVar1._12_4_ = 0;
      pVar1.first = (char *)local_10._0_8_;
      pVar1.second = local_10._8_4_;
      return pVar1;
    }
    local_24 = (uint)*(byte *)(in_RDI + (ulong)local_20);
    local_1c[0] = (local_24 - 1 << ((char)local_20 * '\a' & 0x1fU)) + local_1c[0];
    if (local_24 < 0x80) {
      local_30 = (char *)(in_RDI + (ulong)local_20 + 1);
      std::pair<const_char_*,_int>::pair<const_char_*,_unsigned_int_&,_true>
                ((pair<const_char_*,_int> *)local_10,&local_30,local_1c);
      goto LAB_003d3265;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

std::pair<const char*, int32> ReadSizeFallback(const char* p, uint32 res) {
  for (std::uint32_t i = 1; i < 4; i++) {
    uint32 byte = static_cast<uint8>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  std::uint32_t byte = static_cast<uint8>(p[4]);
  if (PROTOBUF_PREDICT_FALSE(byte >= 8)) return {nullptr, 0};  // size >= 2gb
  res += (byte - 1) << 28;
  // Protect against sign integer overflow in PushLimit. Limits are relative
  // to buffer ends and ptr could potential be kSlopBytes beyond a buffer end.
  // To protect against overflow we reject limits absurdly close to INT_MAX.
  if (PROTOBUF_PREDICT_FALSE(res > INT_MAX - ParseContext::kSlopBytes)) {
    return {nullptr, 0};
  }
  return {p + 5, res};
}